

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

int tga_test(stbi *s)

{
  byte bVar1;
  uint8 uVar2;
  int iVar3;
  int sz;
  stbi *s_local;
  
  get8u(s);
  bVar1 = get8u(s);
  if (bVar1 < 2) {
    uVar2 = get8u(s);
    if (((((uVar2 == '\x01') || (uVar2 == '\x02')) || (uVar2 == '\x03')) ||
        ((uVar2 == '\t' || (uVar2 == '\n')))) || (uVar2 == '\v')) {
      get16(s);
      get16(s);
      get8(s);
      get16(s);
      get16(s);
      iVar3 = get16(s);
      if (iVar3 < 1) {
        s_local._4_4_ = 0;
      }
      else {
        iVar3 = get16(s);
        if (iVar3 < 1) {
          s_local._4_4_ = 0;
        }
        else {
          iVar3 = get8(s);
          if (((iVar3 == 8) || (iVar3 == 0x10)) || ((iVar3 == 0x18 || (iVar3 == 0x20)))) {
            s_local._4_4_ = 1;
          }
          else {
            s_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      s_local._4_4_ = 0;
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int tga_test(stbi *s)
{
	int sz;
	get8u(s);		//	discard Offset
	sz = get8u(s);	//	color type
	if( sz > 1 ) return 0;	//	only RGB or indexed allowed
	sz = get8u(s);	//	image type
	if( (sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11) ) return 0;	//	only RGB or grey allowed, +/- RLE
	get16(s);		//	discard palette start
	get16(s);		//	discard palette length
	get8(s);			//	discard bits per palette color entry
	get16(s);		//	discard x origin
	get16(s);		//	discard y origin
	if( get16(s) < 1 ) return 0;		//	test width
	if( get16(s) < 1 ) return 0;		//	test height
	sz = get8(s);	//	bits per pixel
	if( (sz != 8) && (sz != 16) && (sz != 24) && (sz != 32) ) return 0;	//	only RGB or RGBA or grey allowed
	return 1;		//	seems to have passed everything
}